

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O0

void llama_sampler_chain_add(llama_sampler *chain,llama_sampler *smpl)

{
  value_type *in_RDI;
  llama_sampler_chain *p;
  
  std::vector<llama_sampler_*,_std::allocator<llama_sampler_*>_>::push_back
            ((vector<llama_sampler_*,_std::allocator<llama_sampler_*>_> *)p,in_RDI);
  return;
}

Assistant:

void llama_sampler_chain_add(struct llama_sampler * chain, struct llama_sampler * smpl) {
    auto * p = (llama_sampler_chain *) chain->ctx;
    p->samplers.push_back(smpl);
}